

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_serialization.hpp
# Opt level: O1

TableFunction * __thiscall
duckdb::FunctionSerializer::
DeserializeFunction<duckdb::TableFunction,duckdb::TableFunctionCatalogEntry>
          (TableFunction *__return_storage_ptr__,FunctionSerializer *this,ClientContext *context,
          CatalogType catalog_type,string *name,vector<duckdb::LogicalType,_true> *arguments,
          vector<duckdb::LogicalType,_true> *original_arguments)

{
  pointer pcVar1;
  string *psVar2;
  CatalogEntry *pCVar3;
  InternalException *this_00;
  undefined7 in_register_00000009;
  string *arguments_00;
  EntryLookupInfo lookup_info;
  string local_c0;
  string *local_a0;
  string *local_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  EntryLookupInfo local_50;
  
  local_a0 = (string *)CONCAT71(in_register_00000009,catalog_type);
  local_98 = name;
  EntryLookupInfo::EntryLookupInfo
            (&local_50,(CatalogType)context,local_a0,(QueryErrorContext)0xffffffffffffffff);
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"system","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"main","");
  pCVar3 = Catalog::GetEntry((ClientContext *)this,&local_c0,&local_90,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  psVar2 = local_98;
  if (pCVar3->type == (CatalogType)context) {
    arguments_00 = (string *)arguments;
    if ((arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      arguments_00 = local_98;
    }
    TableFunctionSet::GetFunctionByArguments
              (__return_storage_ptr__,(TableFunctionSet *)&pCVar3[1].comment.value_info_,
               (ClientContext *)this,(vector<duckdb::LogicalType,_true> *)arguments_00);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
              (&(__return_storage_ptr__->super_SimpleNamedParameterFunction).super_SimpleFunction.
                arguments.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               psVar2);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
              (&(__return_storage_ptr__->super_SimpleNamedParameterFunction).super_SimpleFunction.
                original_arguments.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,arguments);
    return __return_storage_ptr__;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c0,"DeserializeFunction - cant find catalog entry for function %s","")
  ;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar1 = (local_a0->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + local_a0->_M_string_length);
  InternalException::InternalException<std::__cxx11::string>(this_00,&local_c0,&local_70);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static FUNC DeserializeFunction(ClientContext &context, CatalogType catalog_type, const string &name,
	                                vector<LogicalType> arguments, vector<LogicalType> original_arguments) {
		EntryLookupInfo lookup_info(catalog_type, name);
		auto &func_catalog = Catalog::GetEntry(context, SYSTEM_CATALOG, DEFAULT_SCHEMA, lookup_info);
		if (func_catalog.type != catalog_type) {
			throw InternalException("DeserializeFunction - cant find catalog entry for function %s", name);
		}
		auto &functions = func_catalog.Cast<CATALOG_ENTRY>();
		auto function = functions.functions.GetFunctionByArguments(
		    context, original_arguments.empty() ? arguments : original_arguments);
		function.arguments = std::move(arguments);
		function.original_arguments = std::move(original_arguments);
		return function;
	}